

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int pmbtoken_issuer_key_from_bytes
              (PMBTOKEN_METHOD *method,TRUST_TOKEN_ISSUER_KEY *key,uint8_t *in,size_t len)

{
  EC_PRECOMP *p0;
  EC_GROUP *group;
  uint uVar1;
  int iVar2;
  int iVar3;
  BIGNUM *bn;
  int iVar4;
  long lVar5;
  EC_PRECOMP *p1;
  CBS tmp;
  EC_SCALAR *scalars [6];
  CBS cbs;
  EC_AFFINE pub_affine [3];
  EC_JACOBIAN pub [3];
  CBS local_4b8;
  TRUST_TOKEN_ISSUER_KEY *local_4a8;
  EC_SCALAR *local_4a0;
  EC_SCALAR *local_498;
  EC_SCALAR *local_490;
  EC_SCALAR *local_488;
  EC_SCALAR *local_480;
  CBS local_478;
  EC_AFFINE local_468;
  undefined1 local_3d8 [144];
  undefined1 local_348 [144];
  EC_JACOBIAN local_2b8;
  EC_JACOBIAN local_1e0;
  EC_JACOBIAN local_108;
  
  group = method->group;
  local_478.data = in;
  local_478.len = len;
  bn = EC_GROUP_get0_order(group);
  uVar1 = BN_num_bytes(bn);
  lVar5 = 0;
  local_4a8 = key;
  local_4a0 = &key->y0;
  local_498 = &key->x1;
  local_490 = &key->y1;
  local_488 = &key->xs;
  local_480 = &key->ys;
  while ((iVar2 = CBS_get_bytes(&local_478,&local_4b8,(ulong)uVar1), iVar2 != 0 &&
         (iVar2 = ec_scalar_from_bytes(group,&(&local_4a8)[lVar5]->x0,local_4b8.data,local_4b8.len),
         iVar2 != 0))) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 6) {
      p0 = &method->g_precomp;
      p1 = &method->h_precomp;
      iVar3 = ec_point_mul_scalar_precomp
                        (group,&local_2b8,p0,&key->x0,p1,&key->y0,(EC_PRECOMP *)0x0,(EC_SCALAR *)0x0
                        );
      iVar4 = 0;
      iVar2 = 0;
      if ((iVar3 != 0) &&
         (iVar3 = ec_init_precomp(group,&key->pub0_precomp,&local_2b8), iVar2 = iVar4, iVar3 != 0))
      {
        iVar3 = ec_point_mul_scalar_precomp
                          (group,&local_1e0,p0,&key->x1,p1,&key->y1,(EC_PRECOMP *)0x0,
                           (EC_SCALAR *)0x0);
        if ((iVar3 != 0) &&
           (iVar3 = ec_init_precomp(group,&key->pub1_precomp,&local_1e0), iVar3 != 0)) {
          iVar3 = ec_point_mul_scalar_precomp
                            (group,&local_108,p0,&key->xs,p1,&key->ys,(EC_PRECOMP *)0x0,
                             (EC_SCALAR *)0x0);
          if (((iVar3 != 0) &&
              (iVar3 = ec_init_precomp(group,&key->pubs_precomp,&local_108), iVar3 != 0)) &&
             (iVar3 = ec_jacobian_to_affine_batch(group,&local_468,&local_2b8,3), iVar3 != 0)) {
            memcpy(&key->pub0,&local_468,0x90);
            memcpy(&key->pub1,local_3d8,0x90);
            memcpy(&key->pubs,local_348,0x90);
            iVar2 = 1;
          }
        }
      }
      return iVar2;
    }
  }
  ERR_put_error(0x20,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                ,0x126);
  return 0;
}

Assistant:

static int pmbtoken_issuer_key_from_bytes(const PMBTOKEN_METHOD *method,
                                          TRUST_TOKEN_ISSUER_KEY *key,
                                          const uint8_t *in, size_t len) {
  const EC_GROUP *group = method->group;
  CBS cbs, tmp;
  CBS_init(&cbs, in, len);
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  EC_SCALAR *scalars[] = {&key->x0, &key->y0, &key->x1,
                          &key->y1, &key->xs, &key->ys};
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(scalars); i++) {
    if (!CBS_get_bytes(&cbs, &tmp, scalar_len) ||
        !ec_scalar_from_bytes(group, scalars[i], CBS_data(&tmp),
                              CBS_len(&tmp))) {
      OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
      return 0;
    }
  }

  // Recompute the public key.
  EC_JACOBIAN pub[3];
  EC_AFFINE pub_affine[3];
  if (!ec_point_mul_scalar_precomp(group, &pub[0], &method->g_precomp, &key->x0,
                                   &method->h_precomp, &key->y0, NULL, NULL) ||
      !ec_init_precomp(group, &key->pub0_precomp, &pub[0]) ||
      !ec_point_mul_scalar_precomp(group, &pub[1], &method->g_precomp, &key->x1,
                                   &method->h_precomp, &key->y1, NULL, NULL) ||
      !ec_init_precomp(group, &key->pub1_precomp, &pub[1]) ||
      !ec_point_mul_scalar_precomp(group, &pub[2], &method->g_precomp, &key->xs,
                                   &method->h_precomp, &key->ys, NULL, NULL) ||
      !ec_init_precomp(group, &key->pubs_precomp, &pub[2]) ||
      !ec_jacobian_to_affine_batch(group, pub_affine, pub, 3)) {
    return 0;
  }

  key->pub0 = pub_affine[0];
  key->pub1 = pub_affine[1];
  key->pubs = pub_affine[2];
  return 1;
}